

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_charRefNumber(ENCODING *UNUSED_enc,char *ptr)

{
  uint uVar1;
  char *pcVar2;
  uint result;
  int iVar3;
  ulong uVar4;
  
  if ((ptr[5] == '\0') && (ptr[4] == 'x')) {
    pcVar2 = ptr + 7;
    result = 0;
    do {
      iVar3 = -1;
      if (*pcVar2 == '\0') {
        if (pcVar2[-1] == ';') {
LAB_004e2aa9:
          iVar3 = checkCharRefNumber(result);
          return iVar3;
        }
        iVar3 = (int)pcVar2[-1];
      }
      uVar1 = iVar3 - 0x30;
      uVar4 = (ulong)uVar1;
      if (uVar1 < 0x37) {
        if ((0x3ffUL >> (uVar4 & 0x3f) & 1) == 0) {
          if ((0x7e0000UL >> (uVar4 & 0x3f) & 1) == 0) {
            if ((0x7e000000000000U >> (uVar4 & 0x3f) & 1) != 0) {
              result = (result * 0x10 + iVar3) - 0x57;
            }
          }
          else {
            result = (result * 0x10 + iVar3) - 0x37;
          }
        }
        else {
          result = uVar1 | result << 4;
        }
      }
      pcVar2 = pcVar2 + 2;
    } while ((int)result < 0x110000);
  }
  else {
    pcVar2 = ptr + 5;
    result = 0;
    do {
      iVar3 = -0x31;
      if (*pcVar2 == '\0') {
        if (pcVar2[-1] == ';') goto LAB_004e2aa9;
        iVar3 = pcVar2[-1] + -0x30;
      }
      result = iVar3 + result * 10;
      pcVar2 = pcVar2 + 2;
    } while ((int)result < 0x110000);
  }
  return -1;
}

Assistant:

PREFIX(charRefNumber)(const ENCODING *UNUSED_P(enc), const char *ptr)
{
  int result = 0;
  /* skip &# */
  ptr += 2*MINBPC(enc);
  if (CHAR_MATCHES(enc, ptr, ASCII_x)) {
    for (ptr += MINBPC(enc);
         !CHAR_MATCHES(enc, ptr, ASCII_SEMI);
         ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      switch (c) {
      case ASCII_0: case ASCII_1: case ASCII_2: case ASCII_3: case ASCII_4:
      case ASCII_5: case ASCII_6: case ASCII_7: case ASCII_8: case ASCII_9:
        result <<= 4;
        result |= (c - ASCII_0);
        break;
      case ASCII_A: case ASCII_B: case ASCII_C:
      case ASCII_D: case ASCII_E: case ASCII_F:
        result <<= 4;
        result += 10 + (c - ASCII_A);
        break;
      case ASCII_a: case ASCII_b: case ASCII_c:
      case ASCII_d: case ASCII_e: case ASCII_f:
        result <<= 4;
        result += 10 + (c - ASCII_a);
        break;
      }
      if (result >= 0x110000)
        return -1;
    }
  }
  else {
    for (; !CHAR_MATCHES(enc, ptr, ASCII_SEMI); ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      result *= 10;
      result += (c - ASCII_0);
      if (result >= 0x110000)
        return -1;
    }
  }
  return checkCharRefNumber(result);
}